

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O1

ssize_t peek_at_header(archive_read_filter *filter,int *pbits,private_data_conflict *state)

{
  bool bVar1;
  size_t sVar2;
  short *psVar3;
  char *pcVar4;
  void *pvVar5;
  byte bVar6;
  uint uVar7;
  size_t min;
  size_t sVar8;
  ssize_t avail;
  long local_48;
  uint local_3c;
  size_t local_38;
  
  psVar3 = (short *)__archive_read_filter_ahead(filter,10,&local_48);
  if (psVar3 == (short *)0x0) {
    return 0;
  }
  if (local_48 == 0) {
    return 0;
  }
  if ((char)psVar3[1] == '\b' && *psVar3 == -0x74e1) {
    bVar6 = *(byte *)((long)psVar3 + 3);
    uVar7 = (uint)bVar6;
    if (uVar7 < 0x20) {
      if (state != (private_data_conflict *)0x0) {
        state->mtime = *(uint32_t *)(psVar3 + 2);
      }
      sVar8 = 10;
      if ((bVar6 & 4) != 0) {
        psVar3 = (short *)__archive_read_filter_ahead(filter,0xc,&local_48);
        if (psVar3 == (short *)0x0) {
          return 0;
        }
        sVar8 = (ulong)(ushort)psVar3[5] + 0xc;
      }
      min = sVar8;
      local_3c = uVar7;
      sVar2 = sVar8;
      if ((bVar6 & 8) != 0) {
        do {
          local_38 = sVar2;
          min = sVar8 + 1;
          if (local_48 <= (long)sVar8) {
            if (local_48 < 0x100001) {
              psVar3 = (short *)__archive_read_filter_ahead(filter,min,&local_48);
              goto LAB_0011a5ee;
            }
LAB_0011a62d:
            bVar1 = false;
            goto LAB_0011a62f;
          }
LAB_0011a5ee:
          if (psVar3 == (short *)0x0) {
            psVar3 = (short *)0x0;
            goto LAB_0011a62d;
          }
          pcVar4 = (char *)((long)psVar3 + sVar8);
          sVar8 = sVar8 + 1;
          sVar2 = local_38;
        } while (*pcVar4 != '\0');
        bVar1 = true;
        if (state != (private_data_conflict *)0x0) {
          free(state->name);
          pcVar4 = strdup((char *)(local_38 + (long)psVar3));
          state->name = pcVar4;
        }
LAB_0011a62f:
        bVar6 = (byte)local_3c;
        if (!bVar1) {
          return 0;
        }
      }
      sVar8 = min;
      if (0xf < bVar6) {
        do {
          min = sVar8 + 1;
          if (local_48 <= (long)sVar8) {
            if (0x100000 < local_48) {
              return 0;
            }
            psVar3 = (short *)__archive_read_filter_ahead(filter,min,&local_48);
          }
          if (psVar3 == (short *)0x0) {
            return 0;
          }
          pcVar4 = (char *)((long)psVar3 + sVar8);
          sVar8 = min;
        } while (*pcVar4 != '\0');
      }
      if ((local_3c & 2) != 0) {
        min = min + 2;
        pvVar5 = __archive_read_filter_ahead(filter,min,&local_48);
        if (pvVar5 == (void *)0x0) {
          return 0;
        }
      }
      if (pbits != (int *)0x0) {
        *pbits = 0x1b;
        return min;
      }
      return min;
    }
  }
  return 0;
}

Assistant:

static ssize_t
peek_at_header(struct archive_read_filter *filter, int *pbits,
#ifdef HAVE_ZLIB_H
	       struct private_data *state
#else
	       void *state
#endif
	      )
{
	const unsigned char *p;
	ssize_t avail, len;
	int bits = 0;
	int header_flags;
#ifndef HAVE_ZLIB_H
	(void)state; /* UNUSED */
#endif

	/* Start by looking at the first ten bytes of the header, which
	 * is all fixed layout. */
	len = 10;
	p = __archive_read_filter_ahead(filter, len, &avail);
	if (p == NULL || avail == 0)
		return (0);
	/* We only support deflation- third byte must be 0x08. */
	if (memcmp(p, "\x1F\x8B\x08", 3) != 0)
		return (0);
	bits += 24;
	if ((p[3] & 0xE0)!= 0)	/* No reserved flags set. */
		return (0);
	bits += 3;
	header_flags = p[3];
	/* Bytes 4-7 are mod time in little endian. */
#ifdef HAVE_ZLIB_H
	if (state)
		state->mtime = archive_le32dec(p + 4);
#endif
	/* Byte 8 is deflate flags. */
	/* XXXX TODO: return deflate flags back to consume_header for use
	   in initializing the decompressor. */
	/* Byte 9 is OS. */

	/* Optional extra data:  2 byte length plus variable body. */
	if (header_flags & 4) {
		p = __archive_read_filter_ahead(filter, len + 2, &avail);
		if (p == NULL)
			return (0);
		len += ((int)p[len + 1] << 8) | (int)p[len];
		len += 2;
	}

	/* Null-terminated optional filename. */
	if (header_flags & 8) {
#ifdef HAVE_ZLIB_H
		ssize_t file_start = len;
#endif
		do {
			++len;
			if (avail < len) {
				if (avail > MAX_FILENAME_LENGTH) {
					return (0);
				}
				p = __archive_read_filter_ahead(filter,
				    len, &avail);
			}
			if (p == NULL)
				return (0);
		} while (p[len - 1] != 0);

#ifdef HAVE_ZLIB_H
		if (state) {
			/* Reset the name in case of repeat header reads. */
			free(state->name);
			state->name = strdup((const char *)&p[file_start]);
		}
#endif
	}

	/* Null-terminated optional comment. */
	if (header_flags & 16) {
		do {
			++len;
			if (avail < len) {
				if (avail > MAX_COMMENT_LENGTH) {
					return (0);
				}
				p = __archive_read_filter_ahead(filter,
				    len, &avail);
			}
			if (p == NULL)
				return (0);
		} while (p[len - 1] != 0);
	}

	/* Optional header CRC */
	if ((header_flags & 2)) {
		p = __archive_read_filter_ahead(filter, len + 2, &avail);
		if (p == NULL)
			return (0);
#if 0
	int hcrc = ((int)p[len + 1] << 8) | (int)p[len];
	int crc = /* XXX TODO: Compute header CRC. */;
	if (crc != hcrc)
		return (0);
	bits += 16;
#endif
		len += 2;
	}

	if (pbits != NULL)
		*pbits = bits;
	return (len);
}